

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t * Wlc_NtkCollectMemFanins(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar5;
  long lVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  if (0 < vMemObjs->nSize) {
    lVar6 = 0;
    do {
      iVar2 = vMemObjs->pArray[lVar6];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = p->pObjs + iVar2;
      if ((*(ushort *)pWVar1 & 0x3f) - 0x36 < 2) {
        uVar3 = pWVar1->nFanins;
        if (0 < (int)uVar3) {
          lVar7 = 0;
          do {
            if ((2 < uVar3) || (paVar5 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)
               ) {
              paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            if (lVar7 != 0) {
              Vec_IntPush(p_00,paVar5->Fanins[lVar7]);
              uVar3 = pWVar1->nFanins;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)uVar3);
        }
      }
      else if ((*(ushort *)pWVar1 & 0x3f) == 8) {
        paVar5 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar5->pFanins[0];
        }
        Vec_IntPush(p_00,paVar5->Fanins[0]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vMemObjs->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemFanins( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs )
{
    Wlc_Obj_t * pObj; int i, k, iFanin;
    Vec_Int_t * vMemFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                    Vec_IntPush( vMemFanins, iFanin );
        }
    }
    return vMemFanins;
}